

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2cAnalyzerResults.cpp
# Opt level: O1

void __thiscall
I2cAnalyzerResults::GenerateBubbleText
          (I2cAnalyzerResults *this,U64 frame_index,Channel *param_2,DisplayBase display_base)

{
  size_t sVar1;
  char ack [32];
  Frame frame;
  char number_str [128];
  stringstream ss;
  char *local_2a8 [2];
  char local_298 [16];
  undefined8 local_288;
  char acStack_280 [32];
  Frame local_260 [16];
  byte local_250;
  undefined7 uStack_24f;
  char local_240;
  byte local_23f;
  char local_238 [128];
  stringstream local_1b8 [16];
  ostream local_1a8 [8];
  string local_1a0 [104];
  ios_base local_138 [264];
  
  AnalyzerResults::ClearResultStrings();
  AnalyzerResults::GetFrame((ulonglong)local_260);
  if ((local_23f & 1) == 0) {
    if ((local_23f & 2) == 0) {
      local_288._0_4_ = 0x4b414e;
    }
    else {
      local_288._0_1_ = 'M';
      local_288._1_1_ = 'i';
      local_288._2_1_ = 's';
      local_288._3_1_ = 's';
      local_288._4_1_ = 'i';
      local_288._5_1_ = 'n';
      local_288._6_1_ = 'g';
      local_288._7_1_ = ' ';
      builtin_strncpy(acStack_280,"ACK/NAK",8);
    }
  }
  else {
    local_288._0_4_ = 0x4b4341;
  }
  if (local_240 == '\0') {
    AnalyzerHelpers::GetNumberString
              (CONCAT71(uStack_24f,local_250) >> 1,display_base,7,local_238,0x80);
    if ((local_250 & 1) == 0) {
      std::__cxx11::stringstream::stringstream(local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"W[",2);
      sVar1 = strlen(local_238);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_238,sVar1);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"]",1);
      std::__cxx11::stringbuf::str();
      AnalyzerResults::AddResultString
                ((char *)this,local_2a8[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      if (local_2a8[0] != local_298) {
        operator_delete(local_2a8[0]);
      }
      local_2a8[0] = local_298;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"");
      std::__cxx11::stringbuf::str(local_1a0);
      if (local_2a8[0] != local_298) {
        operator_delete(local_2a8[0]);
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Write [",7);
      sVar1 = strlen(local_238);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_238,sVar1);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"]",1);
      std::__cxx11::stringbuf::str();
      AnalyzerResults::AddResultString
                ((char *)this,local_2a8[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      if (local_2a8[0] != local_298) {
        operator_delete(local_2a8[0]);
      }
      local_2a8[0] = local_298;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"");
      std::__cxx11::stringbuf::str(local_1a0);
      if (local_2a8[0] != local_298) {
        operator_delete(local_2a8[0]);
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Write [",7);
      sVar1 = strlen(local_238);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_238,sVar1);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"] + ",4);
      sVar1 = strlen((char *)&local_288);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_288,sVar1);
      std::__cxx11::stringbuf::str();
      AnalyzerResults::AddResultString
                ((char *)this,local_2a8[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      if (local_2a8[0] != local_298) {
        operator_delete(local_2a8[0]);
      }
      local_2a8[0] = local_298;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"");
      std::__cxx11::stringbuf::str(local_1a0);
      if (local_2a8[0] != local_298) {
        operator_delete(local_2a8[0]);
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Setup Write to [",0x10);
      sVar1 = strlen(local_238);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_238,sVar1);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"] + ",4);
      sVar1 = strlen((char *)&local_288);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_288,sVar1);
      std::__cxx11::stringbuf::str();
      AnalyzerResults::AddResultString
                ((char *)this,local_2a8[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      std::__cxx11::stringstream::stringstream(local_1b8);
      AnalyzerResults::AddResultString
                ((char *)this,"R",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"R[",2);
      sVar1 = strlen(local_238);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_238,sVar1);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"]",1);
      std::__cxx11::stringbuf::str();
      AnalyzerResults::AddResultString
                ((char *)this,local_2a8[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      if (local_2a8[0] != local_298) {
        operator_delete(local_2a8[0]);
      }
      local_2a8[0] = local_298;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"");
      std::__cxx11::stringbuf::str(local_1a0);
      if (local_2a8[0] != local_298) {
        operator_delete(local_2a8[0]);
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Read [",6);
      sVar1 = strlen(local_238);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_238,sVar1);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"]",1);
      std::__cxx11::stringbuf::str();
      AnalyzerResults::AddResultString
                ((char *)this,local_2a8[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      if (local_2a8[0] != local_298) {
        operator_delete(local_2a8[0]);
      }
      local_2a8[0] = local_298;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"");
      std::__cxx11::stringbuf::str(local_1a0);
      if (local_2a8[0] != local_298) {
        operator_delete(local_2a8[0]);
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Read [",6);
      sVar1 = strlen(local_238);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_238,sVar1);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"] + ",4);
      sVar1 = strlen((char *)&local_288);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_288,sVar1);
      std::__cxx11::stringbuf::str();
      AnalyzerResults::AddResultString
                ((char *)this,local_2a8[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      if (local_2a8[0] != local_298) {
        operator_delete(local_2a8[0]);
      }
      local_2a8[0] = local_298;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"");
      std::__cxx11::stringbuf::str(local_1a0);
      if (local_2a8[0] != local_298) {
        operator_delete(local_2a8[0]);
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Setup Read to [",0xf);
      sVar1 = strlen(local_238);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_238,sVar1);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"] + ",4);
      sVar1 = strlen((char *)&local_288);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_288,sVar1);
      std::__cxx11::stringbuf::str();
      AnalyzerResults::AddResultString
                ((char *)this,local_2a8[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    if (local_2a8[0] == local_298) goto LAB_001066ec;
  }
  else {
    AnalyzerHelpers::GetNumberString(CONCAT71(uStack_24f,local_250),display_base,8,local_238,0x80);
    AnalyzerResults::AddResultString
              ((char *)this,local_238,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    std::__cxx11::stringstream::stringstream(local_1b8);
    sVar1 = strlen(local_238);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_238,sVar1);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8," + ",3);
    sVar1 = strlen((char *)&local_288);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_288,sVar1);
    std::__cxx11::stringbuf::str();
    AnalyzerResults::AddResultString
              ((char *)this,local_2a8[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    if (local_2a8[0] == local_298) goto LAB_001066ec;
  }
  operator_delete(local_2a8[0]);
LAB_001066ec:
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  Frame::~Frame(local_260);
  return;
}

Assistant:

void I2cAnalyzerResults::GenerateBubbleText( U64 frame_index, Channel& /*channel*/,
                                             DisplayBase display_base ) // unrefereced vars commented out to remove warnings.
{
    // we only need to pay attention to 'channel' if we're making bubbles for more than one channel (as set by
    // AddChannelBubblesWillAppearOn)
    ClearResultStrings();
    Frame frame = GetFrame( frame_index );

    char ack[ 32 ];
    if( ( frame.mFlags & I2C_FLAG_ACK ) != 0 )
        snprintf( ack, sizeof( ack ), "ACK" );
    else if( ( frame.mFlags & I2C_MISSING_FLAG_ACK ) != 0 )
        snprintf( ack, sizeof( ack ), "Missing ACK/NAK" );
    else
        snprintf( ack, sizeof( ack ), "NAK" );

    if( frame.mType == I2cAddress )
    {
        char number_str[ 128 ];
        AnalyzerHelpers::GetNumberString( frame.mData1 >> 1, display_base, 7, number_str, 128 );

        I2cDirection direction;
        if( ( frame.mData1 & 0x1 ) != 0 )
            direction = I2C_READ;
        else
            direction = I2C_WRITE;

        if( direction == I2C_READ )
        {
            std::stringstream ss;
            AddResultString( "R" );

            ss << "R[" << number_str << "]";
            AddResultString( ss.str().c_str() );
            ss.str( "" );

            ss << "Read [" << number_str << "]";
            AddResultString( ss.str().c_str() );
            ss.str( "" );

            ss << "Read [" << number_str << "] + " << ack;
            AddResultString( ss.str().c_str() );
            ss.str( "" );

            ss << "Setup Read to [" << number_str << "] + " << ack;
            AddResultString( ss.str().c_str() );
        }
        else
        {
            std::stringstream ss;
            ss << "W[" << number_str << "]";
            AddResultString( ss.str().c_str() );
            ss.str( "" );

            ss << "Write [" << number_str << "]";
            AddResultString( ss.str().c_str() );
            ss.str( "" );

            ss << "Write [" << number_str << "] + " << ack;
            AddResultString( ss.str().c_str() );
            ss.str( "" );

            ss << "Setup Write to [" << number_str << "] + " << ack;
            AddResultString( ss.str().c_str() );
        }
    }
    else
    {
        char number_str[ 128 ];
        AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 8, number_str, 128 );

        AddResultString( number_str );

        std::stringstream ss;
        ss << number_str << " + " << ack;
        AddResultString( ss.str().c_str() );
    }
}